

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

bool __thiscall
presolve::HPresolve::okSetInput
          (HPresolve *this,HighsMipSolver *mipsolver,HighsInt presolve_reduction_limit)

{
  HighsMipSolverData *pHVar1;
  bool bVar2;
  value_type_conflict8 local_1a;
  
  this->mipsolver = mipsolver;
  this->probingContingent = 1000;
  this->probingNumDelCol = 0;
  this->numProbed = 0;
  local_1a = 0;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::_M_fill_assign
            (&this->numProbes,(long)mipsolver->model_->num_col_,&local_1a);
  pHVar1 = (mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  if (mipsolver->model_ == &pHVar1->presolvedModel) {
    std::vector<double,_std::allocator<double>_>::operator=
              (&(pHVar1->presolvedModel).col_lower_,&(pHVar1->domain).col_lower_);
    pHVar1 = (mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    std::vector<double,_std::allocator<double>_>::operator=
              (&(pHVar1->presolvedModel).col_upper_,&(pHVar1->domain).col_upper_);
  }
  else {
    HighsLp::operator=(&pHVar1->presolvedModel,mipsolver->model_);
    mipsolver->model_ =
         &((mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->presolvedModel;
  }
  bVar2 = okSetInput(this,&((mipsolver->mipdata_)._M_t.
                            super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                            .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                           presolvedModel,mipsolver->options_mip_,presolve_reduction_limit,
                     &mipsolver->timer_);
  return bVar2;
}

Assistant:

bool HPresolve::okSetInput(HighsMipSolver& mipsolver,
                           const HighsInt presolve_reduction_limit) {
  this->mipsolver = &mipsolver;

  probingContingent = 1000;
  probingNumDelCol = 0;
  numProbed = 0;
  numProbes.assign(mipsolver.numCol(), 0);

  if (mipsolver.model_ != &mipsolver.mipdata_->presolvedModel) {
    mipsolver.mipdata_->presolvedModel = *mipsolver.model_;
    mipsolver.model_ = &mipsolver.mipdata_->presolvedModel;
  } else {
    mipsolver.mipdata_->presolvedModel.col_lower_ =
        mipsolver.mipdata_->domain.col_lower_;
    mipsolver.mipdata_->presolvedModel.col_upper_ =
        mipsolver.mipdata_->domain.col_upper_;
  }

  return okSetInput(mipsolver.mipdata_->presolvedModel, *mipsolver.options_mip_,
                    presolve_reduction_limit, &mipsolver.timer_);
}